

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QColorDialogPrivate::newHsv(QColorDialogPrivate *this,int h,int s,int v)

{
  QColorLuminancePicker *this_00;
  
  if ((this->super_QDialogPrivate).nativeDialogInUse != false) {
    return;
  }
  QtPrivate::QColorShower::setHsv(this->cs,h,s,v);
  QtPrivate::QColorPicker::setCol(this->cp,h,s);
  this_00 = this->lp;
  this_00->val = v;
  this_00->hue = h;
  this_00->sat = s;
  if (this_00->pix != (QPixmap *)0x0) {
    (**(code **)(*(long *)this_00->pix + 8))();
  }
  this_00->pix = (QPixmap *)0x0;
  QWidget::repaint(&this_00->super_QWidget);
  return;
}

Assistant:

void QColorDialogPrivate::newHsv(int h, int s, int v)
{
    if (!nativeDialogInUse) {
        cs->setHsv(h, s, v);
        cp->setCol(h, s);
        lp->setCol(h, s, v);
    }
}